

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

Literal * __thiscall wasm::Literal::extendToUI64(Literal *__return_storage_ptr__,Literal *this)

{
  if ((this->type).id == 2) {
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)(uint)(this->field_0).i32;
    (__return_storage_ptr__->type).id = 3;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x303,"Literal wasm::Literal::extendToUI64() const");
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }